

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O0

BasicMethodProperties * __thiscall
BasicMethodProperties::operator=(BasicMethodProperties *this,BasicMethodProperties *other)

{
  BasicMethodProperties *other_local;
  BasicMethodProperties *this_local;
  
  this->m_int_value = other->m_int_value;
  std::__cxx11::string::operator=((string *)&this->m_string_value,(string *)&other->m_string_value);
  this->m_int_value2 = other->m_int_value2;
  std::__cxx11::string::operator=
            ((string *)&this->m_string_value2,(string *)&other->m_string_value2);
  StringHolder::operator=(&this->m_string_holder,&other->m_string_holder);
  this->m_long_value = other->m_long_value;
  return this;
}

Assistant:

BasicMethodProperties& operator=( const BasicMethodProperties& other )
  {
    m_int_value = other.m_int_value;
    m_string_value = other.m_string_value;
    m_int_value2 = other.m_int_value2;
    m_string_value2 = other.m_string_value2;
    m_string_holder = other.m_string_holder;
    m_long_value = other.m_long_value;
    return *this;
  }